

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_float_*> *fmt)

{
  float *pfVar1;
  
  std::operator<<(str,"{ ");
  for (pfVar1 = fmt->begin; pfVar1 != fmt->end; pfVar1 = pfVar1 + 1) {
    if (pfVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::ostream::operator<<(str,*pfVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}